

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O1

sexp sexp_make_string_op(sexp ctx,sexp self,sexp_sint_t n,sexp len,sexp ch)

{
  sexp psVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  int c;
  sexp b;
  sexp s;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp local_68;
  sexp_conflict local_60;
  sexp_gc_var_t local_58;
  sexp_gc_var_t local_48;
  
  local_68 = (sexp)0x43e;
  local_60 = (sexp_conflict)0x43e;
  local_58.var = (sexp_conflict *)0x0;
  local_58.next = (sexp_gc_var_t *)0x0;
  local_48.var = (sexp_conflict *)0x0;
  local_48.next = (sexp_gc_var_t *)0x0;
  if ((((ulong)ch & 0xff) == 0x1e) &&
     (c = (int)((ulong)ch >> 8), ch = (sexp)(((long)ch << 0x18) >> 0x1f | 1), 0x7f < c)) {
    if (((ulong)len & 1) == 0) {
      psVar1 = sexp_type_exception(ctx,self,2,len);
      return psVar1;
    }
    uVar3 = 2;
    if (0x7ff < c) {
      uVar3 = (ulong)((0xffff < c) + 3);
    }
    local_68 = sexp_make_bytes_op(ctx,self,n,
                                  (sexp)(uVar3 * (long)((long)&len[-1].value + 0x60bf) | 1),
                                  (sexp)&DAT_0000043e);
    if ((((ulong)local_68 & 3) == 0) && (local_68->tag == 0x13)) {
      return local_68;
    }
    lVar4 = (long)len >> 1;
    if (0 < lVar4) {
      lVar2 = 0x10;
      do {
        sexp_utf8_encode_char((uchar *)((long)&local_68->tag + lVar2),(int)uVar3,c);
        lVar2 = lVar2 + uVar3;
        lVar4 = lVar4 + -1;
      } while (lVar4 != 0);
    }
  }
  else {
    local_68 = sexp_make_bytes_op(ctx,self,n,len,ch);
  }
  if ((((ulong)local_68 & 3) != 0) || (psVar1 = local_68, local_68->tag != 0x13)) {
    local_48.next = &local_58;
    local_58.next = (ctx->value).context.saves;
    (ctx->value).context.saves = local_48.next;
    local_48.var = &local_60;
    (ctx->value).context.saves = &local_48;
    local_58.var = &local_68;
    psVar1 = (sexp)sexp_alloc(ctx,0x20);
    if ((psVar1 != (sexp)0x0) && ((((ulong)psVar1 & 3) != 0 || (psVar1->tag != 0x13)))) {
      psVar1->tag = 9;
    }
    (psVar1->value).type.name = local_68;
    (psVar1->value).type.cpl = (sexp)0x0;
    (psVar1->value).type.slots = (sexp)(local_68->value).flonum;
    (ctx->value).context.saves = local_58.next;
  }
  return psVar1;
}

Assistant:

sexp sexp_make_string_op (sexp ctx, sexp self, sexp_sint_t n, sexp len, sexp ch)
{
  sexp i = (sexp_charp(ch) ? sexp_make_fixnum(sexp_unbox_character(ch)) : ch);
#if SEXP_USE_PACKED_STRINGS
  sexp b;
#else
  sexp_gc_var2(b, s);
#endif
#if SEXP_USE_UTF8_STRINGS
  int j, clen;
  if (sexp_charp(ch) && (sexp_unbox_character(ch) >= 0x80)) {
    sexp_assert_type(ctx, sexp_fixnump, SEXP_FIXNUM, len);
    clen = sexp_utf8_char_byte_count(sexp_unbox_character(ch));
    b = sexp_make_bytes_op(ctx, self, n,
                           sexp_fx_mul(len, sexp_make_fixnum(clen)), SEXP_VOID);
    if (sexp_exceptionp(b)) return b;
    for (j=0; j<sexp_unbox_fixnum(len); j++)
      sexp_utf8_encode_char((unsigned char*)sexp_bytes_data(b)+(j*clen), clen,
                            sexp_unbox_character(ch));
  } else
#endif
  b = sexp_make_bytes_op(ctx, self, n, len, i);
  if (sexp_exceptionp(b)) return b;
#if SEXP_USE_PACKED_STRINGS
  sexp_pointer_tag(b) = SEXP_STRING;
  return b;
#else
  sexp_gc_preserve2(ctx, b, s);
  s = sexp_alloc_type(ctx, string, SEXP_STRING);
  sexp_string_bytes(s) = b;
  sexp_string_offset(s) = 0;
  sexp_string_size(s) = sexp_bytes_length(b);
#if SEXP_USE_STRING_REF_CACHE
  sexp_cached_char_idx(s) = 0;
  sexp_cached_cursor(s) = sexp_make_string_cursor(0);
#endif
  sexp_update_string_index_lookup(ctx, s);
  sexp_gc_release2(ctx);
  return s;
#endif
}